

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

vector<point,_std::allocator<point>_> *
filter_points(vector<point,_std::allocator<point>_> *__return_storage_ptr__,
             vector<point,_std::allocator<point>_> *input)

{
  vector<point,_std::allocator<point>_> *this;
  bool bVar1;
  float *pfVar2;
  ostream *poVar3;
  size_type sVar4;
  size_type sVar5;
  undefined1 auVar6 [16];
  float local_60 [5];
  float local_4c;
  reference local_48;
  point *point;
  iterator __end1;
  iterator __begin1;
  vector<point,_std::allocator<point>_> *__range1;
  float local_20;
  float max_angle;
  float min_angle;
  vector<point,_std::allocator<point>_> *input_local;
  vector<point,_std::allocator<point>_> *output;
  
  max_angle._3_1_ = 0;
  _min_angle = input;
  input_local = __return_storage_ptr__;
  std::vector<point,_std::allocator<point>_>::vector(__return_storage_ptr__);
  this = _min_angle;
  local_20 = 0.0;
  __range1._4_4_ = 0.0;
  __end1 = std::vector<point,_std::allocator<point>_>::begin(_min_angle);
  point = (point *)std::vector<point,_std::allocator<point>_>::end(this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<point_*,_std::vector<point,_std::allocator<point>_>_>
                                     *)&point), bVar1) {
    local_48 = __gnu_cxx::__normal_iterator<point_*,_std::vector<point,_std::allocator<point>_>_>::
               operator*(&__end1);
    local_4c = ::point::angle(local_48);
    pfVar2 = std::min<float>(&local_20,&local_4c);
    local_20 = *pfVar2;
    local_60[0] = ::point::angle(local_48);
    pfVar2 = std::max<float>((float *)((long)&__range1 + 4),local_60);
    __range1._4_4_ = *pfVar2;
    bVar1 = point_allowed(local_48);
    if (bVar1) {
      std::vector<point,_std::allocator<point>_>::push_back(__return_storage_ptr__,local_48);
    }
    __gnu_cxx::__normal_iterator<point_*,_std::vector<point,_std::allocator<point>_>_>::operator++
              (&__end1);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Kept ");
  sVar4 = std::vector<point,_std::allocator<point>_>::size(__return_storage_ptr__);
  auVar6._8_4_ = (int)(sVar4 >> 0x20);
  auVar6._0_8_ = sVar4;
  auVar6._12_4_ = 0x45300000;
  sVar5 = std::vector<point,_std::allocator<point>_>::size(_min_angle);
  poVar3 = (ostream *)
           std::ostream::operator<<
                     (poVar3,(((auVar6._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0)) *
                             100.0) / (double)sVar5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return __return_storage_ptr__;
}

Assistant:

std::vector<point> filter_points(vector<point> &input) {
    vector<point> output;
    float min_angle = 0;
    float max_angle = 0;

    for(auto &point: input) {
        min_angle = min(min_angle, point.angle());
        max_angle = max(max_angle, point.angle());
        if(point_allowed(point)) {
            output.push_back(point);
        }
    }

    //cout << "Min angle is " << min_angle << endl;
    //cout << "Max angle is " << max_angle << endl;
    cout << "Kept " << (100.0 * output.size() / (float) input.size()) << endl;

    return output;
}